

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O1

void __thiscall
AssertionTest_assertLtHandlerShouldBeCalled_Test::TestBody
          (AssertionTest_assertLtHandlerShouldBeCalled_Test *this)

{
  int32_t *actual;
  long lVar1;
  bool bVar2;
  _Alloc_hider this_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  ostream *this_01;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  stringstream expectedMsg;
  AssertionMessage *in_stack_fffffffffffffdd8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_220;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_210;
  string local_208;
  AssertionFailure local_1e8;
  undefined1 local_1a8 [24];
  AssertionMessage local_190;
  _Alloc_hider local_188;
  char local_178 [80];
  ios_base local_128 [264];
  
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_208);
  this_00._M_p = local_208._M_dataplus._M_p;
  if ((stringstream *)local_208._M_dataplus._M_p == (stringstream *)0x0) {
    this_00._M_p = (pointer)operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)this_00._M_p);
    if ((stringstream *)local_208._M_dataplus._M_p != (stringstream *)0x0) {
      lVar1 = *(long *)local_208._M_dataplus._M_p;
      local_208._M_dataplus._M_p = this_00._M_p;
      (**(code **)(lVar1 + 8))();
      this_00._M_p = local_208._M_dataplus._M_p;
    }
  }
  local_208._M_dataplus._M_p = this_00._M_p;
  std::ostream::operator<<((stringstream *)(local_208._M_dataplus._M_p + 0x10),1);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_220);
  _Var3._M_head_impl = local_220._M_head_impl;
  if (local_220._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)_Var3._M_head_impl);
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_220._M_head_impl;
      local_220._M_head_impl = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = local_220._M_head_impl;
    }
  }
  local_220._M_head_impl = _Var3._M_head_impl;
  std::ostream::operator<<((stringstream *)(local_220._M_head_impl + 0x10),1);
  cppassert::internal::getPredicateAssertionFailureMessage_abi_cxx11_
            ((string *)&local_1e8,(internal *)0x165578,"a","b",(char *)&local_208,
             (AssertionMessage *)&local_220,in_stack_fffffffffffffdd8);
  cppassert::AssertionFailure::AssertionFailure
            ((AssertionFailure *)local_1a8,0xb9,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
             ,"virtual void AssertionTest_assertLtHandlerShouldBeCalled_Test::TestBody()",
             (string *)&local_1e8);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_210);
  cppassert::AssertionFailure::onAssertionFailure
            ((AssertionFailure *)local_1a8,(AssertionMessage *)&local_210);
  if (local_210._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_210._M_head_impl + 8))();
  }
  if (local_188._M_p != local_178) {
    operator_delete(local_188._M_p);
  }
  if (local_190.stream_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_190.stream_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_190.stream_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  if ((long *)local_1e8._0_8_ != (long *)((long)&local_1e8 + 0x10U)) {
    operator_delete((void *)local_1e8._0_8_);
  }
  if (local_220._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_220._M_head_impl + 8))();
  }
  if ((stringstream *)local_208._M_dataplus._M_p != (stringstream *)0x0) {
    (**(code **)(*(long *)local_208._M_dataplus._M_p + 8))();
  }
  local_1e8.sourceFileLine_ = 1;
  actual = &(this->super_AssertionTest).assertionHandlerCounter_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a8,"1","assertionHandlerCounter_",(int *)&local_1e8,actual);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    if ((char *)local_1a8._8_8_ == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0xba,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if ((long *)local_1e8._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1e8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_1e8._0_8_ + 8))();
      }
      local_1e8._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"Expected message: ",0x12);
  this_01 = (ostream *)std::ostream::operator<<((ostream *)(local_1a8 + 0x10),1);
  std::__ostream_insert<char,std::char_traits<char>>(this_01," ",1);
  std::ostream::operator<<(this_01,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_AssertionTest).expectedStreamMessage_,(string *)&local_1e8);
  if ((long *)local_1e8._0_8_ != (long *)((long)&local_1e8 + 0x10U)) {
    operator_delete((void *)local_1e8._0_8_);
  }
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_220);
  _Var3._M_head_impl = local_220._M_head_impl;
  if (local_220._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)_Var3._M_head_impl);
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_220._M_head_impl;
      local_220._M_head_impl = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = local_220._M_head_impl;
    }
  }
  local_220._M_head_impl = _Var3._M_head_impl;
  std::ostream::operator<<((stringstream *)(local_220._M_head_impl + 0x10),1);
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_210);
  _Var3._M_head_impl = local_210._M_head_impl;
  if (local_210._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)_Var3._M_head_impl);
    if (local_210._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_210._M_head_impl;
      local_210._M_head_impl = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = local_210._M_head_impl;
    }
  }
  local_210._M_head_impl = _Var3._M_head_impl;
  std::ostream::operator<<((stringstream *)(local_210._M_head_impl + 0x10),1);
  cppassert::internal::getPredicateAssertionFailureMessage_abi_cxx11_
            (&local_208,(internal *)0x165578,"a","b",(char *)&local_220,
             (AssertionMessage *)&local_210,in_stack_fffffffffffffdd8);
  cppassert::AssertionFailure::AssertionFailure
            (&local_1e8,0xbd,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
             ,"virtual void AssertionTest_assertLtHandlerShouldBeCalled_Test::TestBody()",&local_208
            );
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_218);
  _Var3._M_head_impl = local_218._M_head_impl;
  if (local_218._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)_Var3._M_head_impl);
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_218._M_head_impl;
      local_218._M_head_impl = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = local_218._M_head_impl;
    }
  }
  local_218._M_head_impl = _Var3._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_218._M_head_impl + 0x10),"Expected message: ",0x12);
  _Var3._M_head_impl = local_218._M_head_impl;
  if (local_218._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)_Var3._M_head_impl);
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_218._M_head_impl;
      local_218._M_head_impl = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = local_218._M_head_impl;
    }
  }
  local_218._M_head_impl = _Var3._M_head_impl;
  std::ostream::operator<<((stringstream *)(local_218._M_head_impl + 0x10),1);
  _Var3._M_head_impl = local_218._M_head_impl;
  if (local_218._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)_Var3._M_head_impl);
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_218._M_head_impl;
      local_218._M_head_impl = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = local_218._M_head_impl;
    }
  }
  local_218._M_head_impl = _Var3._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_218._M_head_impl + 0x10)," ",1);
  _Var3._M_head_impl = local_218._M_head_impl;
  if (local_218._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)_Var3._M_head_impl);
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar1 = *(long *)local_218._M_head_impl;
      local_218._M_head_impl = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = local_218._M_head_impl;
    }
  }
  local_218._M_head_impl = _Var3._M_head_impl;
  std::ostream::operator<<((stringstream *)(local_218._M_head_impl + 0x10),1);
  cppassert::AssertionFailure::onAssertionFailure(&local_1e8,(AssertionMessage *)&local_218);
  if (local_218._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_218._M_head_impl + 8))();
  }
  if (local_1e8.stackTrace_._M_dataplus._M_p != (pointer)((long)&local_1e8 + 0x30U)) {
    operator_delete(local_1e8.stackTrace_._M_dataplus._M_p);
  }
  if (local_1e8.message_.stream_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_1e8.message_.stream_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_1e8.message_.stream_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (local_210._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_210._M_head_impl + 8))();
  }
  if (local_220._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_220._M_head_impl + 8))();
  }
  local_208._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_1e8,"2","assertionHandlerCounter_",(int *)&local_208,actual);
  if (local_1e8.sourceFileLine_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_208);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_1e8.sourceFileName_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1e8.sourceFileName_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0xbe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_220,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_220);
    if ((long *)local_208._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_208._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_208._M_dataplus._M_p + 8))();
      }
      local_208._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)((long)&local_1e8 + 8),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

TEST_F(AssertionTest, assertLtHandlerShouldBeCalled)
{
    std::int32_t a = 1;
    std::int32_t b = 1;
    CPP_ASSERT_LT(a, b);
    EXPECT_EQ(1, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_LT(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(2, assertionHandlerCounter_);
}